

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::EndFrame(void)

{
  int *piVar1;
  ImVec2 IVar2;
  ImGuiNavLayer IVar3;
  int iVar4;
  ImGuiContextHook *pIVar5;
  _func_void_int_int *p_Var6;
  ImGuiViewportP *pIVar7;
  char *__s1;
  ImGuiWindow *pIVar8;
  ImGuiWindow **ppIVar9;
  unsigned_short *puVar10;
  ImGuiContext *pIVar11;
  ImGuiContext *pIVar12;
  ImGuiContext *pIVar13;
  ImGuiID key;
  int iVar14;
  ImVec2 in_RAX;
  ImGuiContext *g_6;
  ImGuiWindow *pIVar15;
  ImGuiWindow **ppIVar16;
  unsigned_short *__dest;
  byte bVar17;
  char *pcVar18;
  char *label;
  ImGuiContext *g;
  byte bVar19;
  uint uVar20;
  ImGuiContext *g_1;
  ulong uVar21;
  long lVar22;
  long lVar23;
  ulong uVar24;
  bool bVar25;
  uint uVar26;
  uint uVar27;
  float fVar28;
  ImVec2 IVar29;
  float fVar30;
  ImVec2 IVar31;
  float fVar32;
  float fVar33;
  ImVec2 local_38;
  
  pIVar12 = GImGui;
  if (GImGui->FrameCountEnded == GImGui->FrameCount) {
    return;
  }
  iVar14 = (GImGui->Hooks).Size;
  local_38 = in_RAX;
  if (0 < iVar14) {
    lVar22 = 0;
    lVar23 = 0;
    do {
      pIVar5 = (pIVar12->Hooks).Data;
      if (*(int *)(pIVar5 + lVar22 + 4) == 2) {
        (**(code **)(pIVar5 + lVar22 + 0x10))();
        iVar14 = (pIVar12->Hooks).Size;
      }
      lVar23 = lVar23 + 1;
      lVar22 = lVar22 + 0x20;
    } while (lVar23 < iVar14);
  }
  pIVar11 = GImGui;
  iVar14 = (GImGui->CurrentWindowStack).Size;
  while (1 < iVar14) {
    End();
    iVar14 = (pIVar11->CurrentWindowStack).Size;
  }
  p_Var6 = (pIVar12->IO).ImeSetInputScreenPosFn;
  if (p_Var6 != (_func_void_int_int *)0x0) {
    fVar33 = (pIVar12->PlatformImeLastPos).x;
    if ((fVar33 != 3.4028235e+38) || (NAN(fVar33))) {
      fVar32 = (pIVar12->PlatformImePos).x;
      fVar28 = (pIVar12->PlatformImePos).y;
      fVar30 = (pIVar12->PlatformImeLastPos).y - fVar28;
      if ((fVar33 - fVar32) * (fVar33 - fVar32) + fVar30 * fVar30 <= 0.0001) goto LAB_0012156a;
    }
    else {
      fVar32 = (pIVar12->PlatformImePos).x;
      fVar28 = (pIVar12->PlatformImePos).y;
    }
    (*p_Var6)((int)fVar32,(int)fVar28);
    pIVar12->PlatformImeLastPos = pIVar12->PlatformImePos;
  }
LAB_0012156a:
  pIVar12->WithinFrameScopeWithImplicitWindow = false;
  pIVar15 = pIVar12->CurrentWindow;
  if ((pIVar15 != (ImGuiWindow *)0x0) && (pIVar15->WriteAccessed == false)) {
    pIVar15->Active = false;
  }
  End();
  pIVar11 = GImGui;
  if ((GImGui->NavWindowingTarget != (ImGuiWindow *)0x0) &&
     (0.15 < GImGui->NavWindowingTimer || GImGui->NavWindowingTimer == 0.15)) {
    if (GImGui->NavWindowingListWindow == (ImGuiWindow *)0x0) {
      key = ImHashStr("###NavWindowingList",0,0);
      pIVar15 = (ImGuiWindow *)ImGuiStorage::GetVoidPtr(&pIVar11->WindowsById,key);
      pIVar11->NavWindowingListWindow = pIVar15;
    }
    pIVar7 = *(pIVar11->Viewports).Data;
    IVar2 = (pIVar7->super_ImGuiViewport).Size;
    IVar29.x = IVar2.x * 0.2;
    IVar29.y = IVar2.y * 0.2;
    (pIVar11->NextWindowData).SizeConstraintRect.Min = IVar29;
    (pIVar11->NextWindowData).SizeConstraintRect.Max.x = 3.4028235e+38;
    (pIVar11->NextWindowData).SizeConstraintRect.Max.y = 3.4028235e+38;
    (pIVar11->NextWindowData).SizeCallback = (ImGuiSizeCallback)0x0;
    (pIVar11->NextWindowData).SizeCallbackUserData = (void *)0x0;
    IVar2 = (pIVar7->super_ImGuiViewport).Pos;
    IVar29 = (pIVar7->super_ImGuiViewport).Size;
    IVar31.x = IVar29.x * 0.5 + IVar2.x;
    IVar31.y = IVar29.y * 0.5 + IVar2.y;
    (pIVar11->NextWindowData).Flags = (pIVar11->NextWindowData).Flags | 0x11;
    (pIVar11->NextWindowData).PosVal = IVar31;
    (pIVar11->NextWindowData).PosPivotVal.x = 0.5;
    (pIVar11->NextWindowData).PosPivotVal.y = 0.5;
    (pIVar11->NextWindowData).PosCond = 1;
    IVar2 = (pIVar11->Style).WindowPadding;
    fVar32 = IVar2.x;
    fVar33 = IVar2.y;
    local_38.x = fVar32 + fVar32;
    local_38.y = fVar33 + fVar33;
    PushStyleVar(1,&local_38);
    Begin("###NavWindowingList",(bool *)0x0,0xc1347);
    lVar22 = (long)(pIVar11->WindowsFocusOrder).Size;
    if (0 < lVar22) {
      do {
        pIVar15 = (pIVar11->WindowsFocusOrder).Data[lVar22 + -1];
        if (((pIVar15->WasActive == true) && (pIVar15->RootWindow == pIVar15)) &&
           (uVar20 = pIVar15->Flags, (uVar20 >> 0x13 & 1) == 0)) {
          __s1 = pIVar15->Name;
          pcVar18 = __s1;
          if (__s1 == (char *)0xffffffffffffffff) {
LAB_00121714:
            label = "(Popup)";
            if ((uVar20 >> 0x1a & 1) == 0) {
              if ((uVar20 >> 10 & 1) != 0) {
                iVar14 = strcmp(__s1,"##MainMenuBar");
                label = "(Main menu bar)";
                if (iVar14 == 0) goto LAB_00121745;
              }
              label = "(Untitled)";
            }
          }
          else {
            do {
              if (*pcVar18 == '#') {
                if (pcVar18[1] == '#') goto LAB_0012170a;
              }
              else if (*pcVar18 == '\0') goto LAB_0012170a;
              pcVar18 = pcVar18 + 1;
            } while (pcVar18 != (char *)0xffffffffffffffff);
            pcVar18 = (char *)0xffffffffffffffff;
LAB_0012170a:
            label = __s1;
            if (__s1 == pcVar18) goto LAB_00121714;
          }
LAB_00121745:
          local_38.x = 0.0;
          local_38.y = 0.0;
          Selectable(label,pIVar11->NavWindowingTarget == pIVar15,0,&local_38);
        }
        bVar25 = 1 < lVar22;
        lVar22 = lVar22 + -1;
      } while (bVar25);
    }
    End();
    PopStyleVar(1);
  }
  pIVar13 = GImGui;
  pIVar15 = pIVar11->NavWrapRequestWindow;
  if (((((pIVar15 != (ImGuiWindow *)0x0) && (pIVar11->NavWindow == pIVar15)) &&
       ((GImGui->NavMoveRequest == true &&
        (((GImGui->NavMoveResultLocal).ID == 0 && ((GImGui->NavMoveResultOther).ID == 0)))))) &&
      (pIVar11->NavMoveRequestForward == ImGuiNavForward_None)) &&
     (pIVar11->NavLayer == ImGuiNavLayer_Main)) {
    uVar20 = pIVar11->NavWrapRequestFlags;
    fVar33 = pIVar15->NavRectRel[0].Min.y;
    fVar32 = pIVar15->NavRectRel[0].Max.y;
    uVar26 = pIVar11->NavMoveDir;
    bVar25 = (uVar20 & 5) == 0;
    if (uVar26 == 0) {
      if ((uVar20 & 5) == 0) goto LAB_00121b1d;
      fVar28 = (pIVar15->SizeFull).x;
      fVar30 = (pIVar15->WindowPadding).x;
      fVar30 = fVar30 + fVar30 + (pIVar15->ContentSize).x;
      uVar26 = -(uint)(fVar30 <= fVar28);
      fVar28 = (float)(uVar26 & (uint)fVar28 | ~uVar26 & (uint)fVar30) - (pIVar15->Scroll).x;
      if ((uVar20 & 4) != 0) {
        fVar30 = fVar32 - fVar33;
        fVar33 = fVar33 - fVar30;
        fVar32 = fVar32 - fVar30;
      }
      uVar26 = (uVar20 & 4) >> 1;
      GImGui->NavMoveRequest = false;
      pIVar13->NavAnyRequest = pIVar13->NavInitRequest;
      pIVar13->NavMoveDir = 0;
      pIVar13->NavMoveClipDir = uVar26;
      pIVar13->NavMoveRequestForward = ImGuiNavForward_ForwardQueued;
      pIVar13->NavMoveRequestFlags = uVar20;
      pIVar8 = pIVar13->NavWindow;
      IVar3 = pIVar13->NavLayer;
      pIVar8->NavRectRel[IVar3].Min.x = fVar28;
      pIVar8->NavRectRel[IVar3].Min.y = fVar33;
      pIVar8->NavRectRel[IVar3].Max.x = fVar28;
      pIVar8->NavRectRel[IVar3].Max.y = fVar32;
      uVar27 = pIVar11->NavMoveDir;
      bVar25 = false;
      fVar30 = fVar28;
    }
    else {
      fVar28 = pIVar15->NavRectRel[0].Min.x;
      fVar30 = pIVar15->NavRectRel[0].Max.x;
      uVar27 = uVar26;
    }
    if (uVar27 == 1 && !bVar25) {
      fVar28 = -(pIVar15->Scroll).x;
      if ((uVar20 & 4) != 0) {
        fVar30 = fVar32 - fVar33;
        fVar33 = fVar33 + fVar30;
        fVar32 = fVar32 + fVar30;
        uVar26 = 3;
      }
      pIVar13->NavMoveRequest = false;
      pIVar13->NavAnyRequest = pIVar13->NavInitRequest;
      pIVar13->NavMoveDir = 1;
      pIVar13->NavMoveClipDir = uVar26;
      pIVar13->NavMoveRequestForward = ImGuiNavForward_ForwardQueued;
      pIVar13->NavMoveRequestFlags = uVar20;
      pIVar8 = pIVar13->NavWindow;
      IVar3 = pIVar13->NavLayer;
      pIVar8->NavRectRel[IVar3].Min.x = fVar28;
      pIVar8->NavRectRel[IVar3].Min.y = fVar33;
      pIVar8->NavRectRel[IVar3].Max.x = fVar28;
      pIVar8->NavRectRel[IVar3].Max.y = fVar32;
      uVar27 = pIVar11->NavMoveDir;
      fVar30 = fVar28;
    }
    if ((uVar20 & 10) != 0 && uVar27 == 2) {
      fVar33 = (pIVar15->SizeFull).y;
      fVar32 = (pIVar15->WindowPadding).y;
      fVar32 = fVar32 + fVar32 + (pIVar15->ContentSize).y;
      uVar27 = -(uint)(fVar32 <= fVar33);
      fVar33 = (float)(uVar27 & (uint)fVar33 | ~uVar27 & (uint)fVar32) - (pIVar15->Scroll).y;
      if ((uVar20 & 8) != 0) {
        fVar32 = fVar30 - fVar28;
        fVar28 = fVar28 - fVar32;
        fVar30 = fVar30 - fVar32;
        uVar26 = 0;
      }
      pIVar13->NavMoveRequest = false;
      pIVar13->NavAnyRequest = pIVar13->NavInitRequest;
      pIVar13->NavMoveDir = 2;
      pIVar13->NavMoveClipDir = uVar26;
      pIVar13->NavMoveRequestForward = ImGuiNavForward_ForwardQueued;
      pIVar13->NavMoveRequestFlags = uVar20;
      pIVar8 = pIVar13->NavWindow;
      IVar3 = pIVar13->NavLayer;
      pIVar8->NavRectRel[IVar3].Min.x = fVar28;
      pIVar8->NavRectRel[IVar3].Min.y = fVar33;
      pIVar8->NavRectRel[IVar3].Max.x = fVar30;
      pIVar8->NavRectRel[IVar3].Max.y = fVar33;
      uVar27 = pIVar11->NavMoveDir;
    }
    if (uVar27 == 3 && (uVar20 & 10) != 0) {
      fVar33 = -(pIVar15->Scroll).y;
      if ((uVar20 & 8) != 0) {
        fVar32 = fVar30 - fVar28;
        fVar28 = fVar28 + fVar32;
        fVar30 = fVar30 + fVar32;
        uVar26 = 1;
      }
      pIVar13->NavMoveRequest = false;
      pIVar13->NavAnyRequest = pIVar13->NavInitRequest;
      pIVar13->NavMoveDir = 3;
      pIVar13->NavMoveClipDir = uVar26;
      pIVar13->NavMoveRequestForward = ImGuiNavForward_ForwardQueued;
      pIVar13->NavMoveRequestFlags = uVar20;
      pIVar15 = pIVar13->NavWindow;
      IVar3 = pIVar13->NavLayer;
      pIVar15->NavRectRel[IVar3].Min.x = fVar28;
      pIVar15->NavRectRel[IVar3].Min.y = fVar33;
      pIVar15->NavRectRel[IVar3].Max.x = fVar30;
      pIVar15->NavRectRel[IVar3].Max.y = fVar33;
    }
  }
LAB_00121b1d:
  bVar17 = pIVar12->DragDropActive;
  iVar14 = pIVar12->FrameCount;
  if ((bool)bVar17 != true) goto LAB_00121b7e;
  if ((pIVar12->DragDropPayload).DataFrameCount + 1 < iVar14) {
    if ((pIVar12->DragDropSourceFlags & 0x20) == 0) {
      bVar19 = (GImGui->IO).MouseDown[pIVar12->DragDropMouseButton] ^ 1;
      goto LAB_00121b64;
    }
  }
  else {
    bVar19 = 0;
LAB_00121b64:
    if ((bVar19 == 0) && ((pIVar12->DragDropPayload).Delivery == false)) goto LAB_00121b7e;
  }
  ClearDragDrop();
  bVar17 = pIVar12->DragDropActive;
  iVar14 = pIVar12->FrameCount;
LAB_00121b7e:
  if ((((bVar17 & 1) != 0) && (pIVar12->DragDropSourceFrameCount < iVar14)) &&
     ((pIVar12->DragDropSourceFlags & 1) == 0)) {
    pIVar12->DragDropWithinSource = true;
    SetTooltip("...");
    pIVar12->DragDropWithinSource = false;
    iVar14 = pIVar12->FrameCount;
  }
  pIVar12->WithinFrameScope = false;
  pIVar12->FrameCountEnded = iVar14;
  UpdateMouseMovingWindowEndFrame();
  uVar20 = (pIVar12->WindowsTempSortBuffer).Capacity;
  if ((int)uVar20 < 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    uVar20 = 0;
    ppIVar16 = (ImGuiWindow **)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    ppIVar9 = (pIVar12->WindowsTempSortBuffer).Data;
    if (ppIVar9 != (ImGuiWindow **)0x0) {
      memcpy(ppIVar16,ppIVar9,(long)(pIVar12->WindowsTempSortBuffer).Size << 3);
      ppIVar9 = (pIVar12->WindowsTempSortBuffer).Data;
      if ((ppIVar9 != (ImGuiWindow **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(ppIVar9,GImAllocatorUserData);
    }
    (pIVar12->WindowsTempSortBuffer).Data = ppIVar16;
    (pIVar12->WindowsTempSortBuffer).Capacity = 0;
  }
  (pIVar12->WindowsTempSortBuffer).Size = 0;
  uVar26 = (pIVar12->Windows).Size;
  uVar24 = (ulong)uVar26;
  if ((int)uVar20 < (int)uVar26) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    ppIVar16 = (ImGuiWindow **)(*GImAllocatorAllocFunc)(uVar24 * 8,GImAllocatorUserData);
    ppIVar9 = (pIVar12->WindowsTempSortBuffer).Data;
    if (ppIVar9 != (ImGuiWindow **)0x0) {
      memcpy(ppIVar16,ppIVar9,(long)(pIVar12->WindowsTempSortBuffer).Size << 3);
      ppIVar9 = (pIVar12->WindowsTempSortBuffer).Data;
      if ((ppIVar9 != (ImGuiWindow **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(ppIVar9,GImAllocatorUserData);
    }
    (pIVar12->WindowsTempSortBuffer).Data = ppIVar16;
    (pIVar12->WindowsTempSortBuffer).Capacity = uVar26;
    uVar24 = (ulong)(uint)(pIVar12->Windows).Size;
    uVar20 = uVar26;
  }
  if ((int)uVar24 == 0) {
    iVar14 = 0;
  }
  else {
    uVar21 = 0;
    do {
      pIVar15 = (pIVar12->Windows).Data[uVar21];
      if ((pIVar15->Active != true) || ((pIVar15->Flags & 0x1000000) == 0)) {
        AddWindowToSortBuffer(&pIVar12->WindowsTempSortBuffer,pIVar15);
        uVar24 = (ulong)(uint)(pIVar12->Windows).Size;
      }
      uVar21 = uVar21 + 1;
      iVar14 = (int)uVar24;
    } while (uVar21 != uVar24);
    uVar20 = (pIVar12->WindowsTempSortBuffer).Capacity;
  }
  iVar4 = (pIVar12->WindowsTempSortBuffer).Size;
  (pIVar12->WindowsTempSortBuffer).Size = iVar14;
  (pIVar12->Windows).Size = iVar4;
  (pIVar12->WindowsTempSortBuffer).Capacity = (pIVar12->Windows).Capacity;
  (pIVar12->Windows).Capacity = uVar20;
  ppIVar9 = (pIVar12->WindowsTempSortBuffer).Data;
  (pIVar12->WindowsTempSortBuffer).Data = (pIVar12->Windows).Data;
  (pIVar12->Windows).Data = ppIVar9;
  (pIVar12->IO).MetricsActiveWindows = pIVar12->WindowsActiveCount;
  ((pIVar12->IO).Fonts)->Locked = false;
  (pIVar12->IO).MouseWheel = 0.0;
  (pIVar12->IO).MouseWheelH = 0.0;
  if ((pIVar12->IO).InputQueueCharacters.Capacity < 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    __dest = (unsigned_short *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    puVar10 = (pIVar12->IO).InputQueueCharacters.Data;
    if (puVar10 != (unsigned_short *)0x0) {
      memcpy(__dest,puVar10,(long)(pIVar12->IO).InputQueueCharacters.Size * 2);
      puVar10 = (pIVar12->IO).InputQueueCharacters.Data;
      if ((puVar10 != (unsigned_short *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(puVar10,GImAllocatorUserData);
    }
    (pIVar12->IO).InputQueueCharacters.Data = __dest;
    (pIVar12->IO).InputQueueCharacters.Capacity = 0;
  }
  (pIVar12->IO).InputQueueCharacters.Size = 0;
  (pIVar12->IO).NavInputs[0] = 0.0;
  (pIVar12->IO).NavInputs[1] = 0.0;
  (pIVar12->IO).NavInputs[2] = 0.0;
  (pIVar12->IO).NavInputs[3] = 0.0;
  (pIVar12->IO).NavInputs[4] = 0.0;
  (pIVar12->IO).NavInputs[5] = 0.0;
  (pIVar12->IO).NavInputs[6] = 0.0;
  (pIVar12->IO).NavInputs[7] = 0.0;
  (pIVar12->IO).NavInputs[8] = 0.0;
  (pIVar12->IO).NavInputs[9] = 0.0;
  (pIVar12->IO).NavInputs[10] = 0.0;
  (pIVar12->IO).NavInputs[0xb] = 0.0;
  (pIVar12->IO).NavInputs[0xc] = 0.0;
  (pIVar12->IO).NavInputs[0xd] = 0.0;
  (pIVar12->IO).NavInputs[0xe] = 0.0;
  (pIVar12->IO).NavInputs[0xf] = 0.0;
  (pIVar12->IO).NavInputs[0x10] = 0.0;
  (pIVar12->IO).NavInputs[0x11] = 0.0;
  (pIVar12->IO).NavInputs[0x12] = 0.0;
  (pIVar12->IO).NavInputs[0x13] = 0.0;
  (pIVar12->IO).NavInputs[0x14] = 0.0;
  iVar14 = (pIVar12->Hooks).Size;
  if (0 < iVar14) {
    lVar22 = 0;
    lVar23 = 0;
    do {
      pIVar5 = (pIVar12->Hooks).Data;
      if (*(int *)(pIVar5 + lVar22 + 4) == 3) {
        (**(code **)(pIVar5 + lVar22 + 0x10))(pIVar12,pIVar5 + lVar22);
        iVar14 = (pIVar12->Hooks).Size;
      }
      lVar23 = lVar23 + 1;
      lVar22 = lVar22 + 0x20;
    } while (lVar23 < iVar14);
  }
  return;
}

Assistant:

void ImGui::EndFrame()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);

    // Don't process EndFrame() multiple times.
    if (g.FrameCountEnded == g.FrameCount)
        return;
    IM_ASSERT(g.WithinFrameScope && "Forgot to call ImGui::NewFrame()?");

    CallContextHooks(&g, ImGuiContextHookType_EndFramePre);

    ErrorCheckEndFrameSanityChecks();

    // Notify OS when our Input Method Editor cursor has moved (e.g. CJK inputs using Microsoft IME)
    if (g.IO.ImeSetInputScreenPosFn && (g.PlatformImeLastPos.x == FLT_MAX || ImLengthSqr(g.PlatformImeLastPos - g.PlatformImePos) > 0.0001f))
    {
        g.IO.ImeSetInputScreenPosFn((int)g.PlatformImePos.x, (int)g.PlatformImePos.y);
        g.PlatformImeLastPos = g.PlatformImePos;
    }

    // Hide implicit/fallback "Debug" window if it hasn't been used
    g.WithinFrameScopeWithImplicitWindow = false;
    if (g.CurrentWindow && !g.CurrentWindow->WriteAccessed)
        g.CurrentWindow->Active = false;
    End();

    // Update navigation: CTRL+Tab, wrap-around requests
    NavEndFrame();

    // Drag and Drop: Elapse payload (if delivered, or if source stops being submitted)
    if (g.DragDropActive)
    {
        bool is_delivered = g.DragDropPayload.Delivery;
        bool is_elapsed = (g.DragDropPayload.DataFrameCount + 1 < g.FrameCount) && ((g.DragDropSourceFlags & ImGuiDragDropFlags_SourceAutoExpirePayload) || !IsMouseDown(g.DragDropMouseButton));
        if (is_delivered || is_elapsed)
            ClearDragDrop();
    }

    // Drag and Drop: Fallback for source tooltip. This is not ideal but better than nothing.
    if (g.DragDropActive && g.DragDropSourceFrameCount < g.FrameCount && !(g.DragDropSourceFlags & ImGuiDragDropFlags_SourceNoPreviewTooltip))
    {
        g.DragDropWithinSource = true;
        SetTooltip("...");
        g.DragDropWithinSource = false;
    }

    // End frame
    g.WithinFrameScope = false;
    g.FrameCountEnded = g.FrameCount;

    // Initiate moving window + handle left-click and right-click focus
    UpdateMouseMovingWindowEndFrame();

    // Sort the window list so that all child windows are after their parent
    // We cannot do that on FocusWindow() because children may not exist yet
    g.WindowsTempSortBuffer.resize(0);
    g.WindowsTempSortBuffer.reserve(g.Windows.Size);
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        if (window->Active && (window->Flags & ImGuiWindowFlags_ChildWindow))       // if a child is active its parent will add it
            continue;
        AddWindowToSortBuffer(&g.WindowsTempSortBuffer, window);
    }

    // This usually assert if there is a mismatch between the ImGuiWindowFlags_ChildWindow / ParentWindow values and DC.ChildWindows[] in parents, aka we've done something wrong.
    IM_ASSERT(g.Windows.Size == g.WindowsTempSortBuffer.Size);
    g.Windows.swap(g.WindowsTempSortBuffer);
    g.IO.MetricsActiveWindows = g.WindowsActiveCount;

    // Unlock font atlas
    g.IO.Fonts->Locked = false;

    // Clear Input data for next frame
    g.IO.MouseWheel = g.IO.MouseWheelH = 0.0f;
    g.IO.InputQueueCharacters.resize(0);
    memset(g.IO.NavInputs, 0, sizeof(g.IO.NavInputs));

    CallContextHooks(&g, ImGuiContextHookType_EndFramePost);
}